

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<1536U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<1536U,_unsigned_int,_void,_true>::operator+=
          (uintwide_t<1536U,_unsigned_int,_void,_true> *this,
          uintwide_t<1536U,_unsigned_int,_void,_true> *other)

{
  uintwide_t<1536U,_unsigned_int,_void,_true> self;
  
  if (this == other) {
    memcpy(&self,other,0xc0);
    other = &self;
  }
  uintwide_t<1536u,unsigned_int,void,true>::
  eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
            ((uint *)this,(uint *)this,(uint *)other,0x30,0);
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }